

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O0

QString * QInputDialog::getText
                    (QWidget *parent,QString *title,QString *label,EchoMode mode,QString *text,
                    bool *ok,WindowFlags flags,InputMethodHints inputMethodHints)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QWidget *parent_00;
  QInputDialog *pQVar4;
  QInputDialog *in_RDI;
  undefined4 in_R8D;
  QString *in_R9;
  long in_FS_OFFSET;
  long in_stack_00000008;
  int ret;
  QAutoPointer<QInputDialog> dialog;
  EchoMode mode_00;
  QInputDialog *this;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  QFlagsStorage<Qt::InputMethodHint> hints;
  undefined4 in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  parent_00 = (QWidget *)operator_new(0x28);
  QInputDialog((QInputDialog *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               parent_00,(QFlagsStorageHelper<Qt::WindowType,_4>)SUB84((ulong)in_R9 >> 0x20,0));
  QAutoPointer<QInputDialog>::QAutoPointer((QAutoPointer<QInputDialog> *)this,in_RDI);
  mode_00 = (EchoMode)((ulong)in_RDI >> 0x20);
  QAutoPointer<QInputDialog>::operator->((QAutoPointer<QInputDialog> *)0x79d88a);
  QWidget::setWindowTitle((QWidget *)CONCAT44(in_R8D,in_stack_ffffffffffffffb0),in_R9);
  QAutoPointer<QInputDialog>::operator->((QAutoPointer<QInputDialog> *)0x79d8a1);
  setLabelText((QInputDialog *)CONCAT44(in_R8D,in_stack_ffffffffffffffb0),in_R9);
  hints.i = (Int)((ulong)in_R9 >> 0x20);
  QAutoPointer<QInputDialog>::operator->((QAutoPointer<QInputDialog> *)0x79d8b8);
  setTextValue((QInputDialog *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (QString *)parent_00);
  QAutoPointer<QInputDialog>::operator->((QAutoPointer<QInputDialog> *)0x79d8cf);
  setTextEchoMode(this,mode_00);
  QAutoPointer<QInputDialog>::operator->((QAutoPointer<QInputDialog> *)0x79d8e5);
  QWidget::setInputMethodHints(parent_00,(InputMethodHints)hints.i);
  pQVar4 = QAutoPointer<QInputDialog>::operator->((QAutoPointer<QInputDialog> *)0x79d903);
  iVar3 = (**(code **)(*(long *)&(pQVar4->super_QDialog).super_QWidget + 0x1a8))();
  if (in_stack_00000008 != 0) {
    *(bool *)in_stack_00000008 = iVar3 != 0;
  }
  bVar2 = QAutoPointer::operator_cast_to_bool((QAutoPointer<QInputDialog> *)0x79d943);
  if ((bVar2) && (iVar3 != 0)) {
    QAutoPointer<QInputDialog>::operator->((QAutoPointer<QInputDialog> *)0x79d95a);
    textValue((QInputDialog *)parent_00);
  }
  else {
    QString::QString((QString *)0x79d979);
  }
  QAutoPointer<QInputDialog>::~QAutoPointer((QAutoPointer<QInputDialog> *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QString *)this;
}

Assistant:

QString QInputDialog::getText(QWidget *parent, const QString &title, const QString &label,
                              QLineEdit::EchoMode mode, const QString &text, bool *ok,
                              Qt::WindowFlags flags, Qt::InputMethodHints inputMethodHints)
{
    QAutoPointer<QInputDialog> dialog(new QInputDialog(parent, flags));
    dialog->setWindowTitle(title);
    dialog->setLabelText(label);
    dialog->setTextValue(text);
    dialog->setTextEchoMode(mode);
    dialog->setInputMethodHints(inputMethodHints);

    const int ret = dialog->exec();
    if (ok)
        *ok = !!ret;
    if (bool(dialog) && ret) {
        return dialog->textValue();
    } else {
        return QString();
    }
}